

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O3

void __thiscall argsman_tests::util_GetChainTypeString::test_method(util_GetChainTypeString *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long *plVar7;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  check_type cVar8;
  string in_stack_fffffffffffff2c8;
  char *local_d00;
  char *local_cf8;
  undefined1 *local_cf0;
  undefined1 *local_ce8;
  char *local_ce0;
  char *local_cd8;
  undefined1 *local_cd0;
  undefined1 *local_cc8;
  char *local_cc0;
  char *local_cb8;
  char *local_cb0;
  char *local_ca8;
  undefined1 *local_ca0;
  undefined1 *local_c98;
  char *local_c90;
  char *local_c88;
  undefined1 *local_c80;
  undefined1 *local_c78;
  char *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c58;
  undefined1 *local_c50;
  undefined1 *local_c48;
  char *local_c40;
  char *local_c38;
  char *local_c00;
  char *local_bf8;
  undefined1 *local_bf0;
  undefined1 *local_be8;
  char *local_be0;
  char *local_bd8;
  undefined1 *local_bd0;
  undefined1 *local_bc8;
  char *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  undefined1 *local_ba0;
  undefined1 *local_b98;
  char *local_b90;
  char *local_b88;
  undefined1 *local_b80;
  undefined1 *local_b78;
  char *local_b70;
  char *local_b68;
  char *local_b60;
  char *local_b58;
  undefined1 *local_b50;
  undefined1 *local_b48;
  char *local_b40;
  char *local_b38;
  undefined1 *local_b30;
  undefined1 *local_b28;
  char *local_b20;
  char *local_b18;
  char *local_b10;
  char *local_b08;
  undefined1 *local_b00;
  undefined1 *local_af8;
  char *local_af0;
  char *local_ae8;
  char *local_ab0;
  char *local_aa8;
  undefined1 *local_aa0;
  undefined1 *local_a98;
  char *local_a90;
  char *local_a88;
  undefined1 *local_a80;
  undefined1 *local_a78;
  char *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  undefined1 *local_a50;
  undefined1 *local_a48;
  char *local_a40;
  char *local_a38;
  undefined1 *local_a30;
  undefined1 *local_a28;
  char *local_a20;
  char *local_a18;
  char *local_a10;
  char *local_a08;
  undefined1 *local_a00;
  undefined1 *local_9f8;
  char *local_9f0;
  char *local_9e8;
  char *local_9b0;
  char *local_9a8;
  undefined1 *local_9a0;
  undefined1 *local_998;
  char *local_990;
  char *local_988;
  undefined1 *local_980;
  undefined1 *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  undefined1 *local_950;
  undefined1 *local_948;
  char *local_940;
  char *local_938;
  undefined1 *local_930;
  undefined1 *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  undefined1 *local_900;
  undefined1 *local_8f8;
  char *local_8f0;
  char *local_8e8;
  undefined1 *local_8e0;
  undefined1 *local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  undefined1 *local_8b0;
  undefined1 *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_860;
  char *local_858;
  undefined1 *local_850;
  undefined1 *local_848;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  undefined1 *local_800;
  undefined1 *local_7f8;
  char *local_7f0;
  char *local_7e8;
  undefined1 *local_7e0;
  undefined1 *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  undefined1 local_650 [16];
  undefined1 *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  pointer local_5d8;
  element_type *local_5d0;
  shared_count sStack_5c8;
  char **local_5c0;
  string *local_5b8;
  char *local_5b0;
  char *local_5a8;
  assertion_result local_5a0;
  string local_588;
  long *local_568 [2];
  long local_558 [2];
  long *local_548 [2];
  long local_538 [2];
  string local_528;
  long *local_508 [2];
  long local_4f8 [2];
  long *local_4e8 [2];
  long local_4d8 [2];
  long *local_4c8 [2];
  long local_4b8 [2];
  string local_4a8;
  long *local_488 [2];
  long local_478 [2];
  long *local_468 [2];
  long local_458 [2];
  string local_448;
  long *local_428 [2];
  long local_418 [2];
  long *local_408 [2];
  long local_3f8 [2];
  long *local_3e8 [2];
  long local_3d8 [2];
  string local_3c8;
  string local_3a8;
  string error;
  char *argv_both [3];
  char *argv_test_no_reg [3];
  char *argv_regtest [2];
  char *argv_testnet4 [2];
  char *argv_testnet [2];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  uint local_2d8;
  string local_2d0 [32];
  undefined4 local_2b0;
  string local_2a8 [16];
  long local_298 [2];
  undefined4 local_288;
  TestArgsManager test_args;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&test_args.super_ArgsManager);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&test_args.super_ArgsManager.m_network_only_args._M_t);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f8,"-testnet",(allocator<char> *)&error);
  local_2d8 = 1;
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d0,"-testnet4",(allocator<char> *)&error);
  local_2b0 = 1;
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"-regtest",(allocator<char> *)&error)
  ;
  local_288 = 1;
  __l._M_len = 3;
  __l._M_array = (iterator)local_2f8;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)&local_5d8,__l,(allocator_type *)&error);
  TestArgsManager::SetupArgs
            (&test_args,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)&local_5d8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&local_5d8);
  lVar4 = -0x78;
  plVar7 = local_298;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    plVar7 = plVar7 + -5;
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 0);
  argv_testnet[0] = "cmd";
  argv_testnet[1] = "-testnet";
  argv_testnet4[0] = "cmd";
  argv_testnet4[1] = "-testnet4";
  argv_regtest[0] = "cmd";
  argv_regtest[1] = "-regtest";
  argv_test_no_reg[2] = "-noregtest";
  argv_test_no_reg[0] = "cmd";
  argv_test_no_reg[1] = "-testnet";
  argv_both[2] = "-regtest";
  argv_both[0] = "cmd";
  argv_both[1] = "-testnet";
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  local_5f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x296;
  file.m_begin = (iterator)&local_5f0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_600,msg);
  _cVar8 = 0x27c72f;
  bVar2 = ArgsManager::ParseParameters(&test_args.super_ArgsManager,0,argv_testnet,&error);
  local_5d8 = (pointer)CONCAT71(local_5d8._1_7_,bVar2);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_2e8._8_8_ = local_650;
  local_650._0_8_ = "test_args.ParseParameters(0, argv_testnet, error)";
  local_650._8_8_ = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_608 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,0,WARN,_cVar8,
             (size_t)&local_610,0x296);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_620 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x297;
  file_00.m_begin = (iterator)&local_620;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_630,
             msg_00);
  local_650._8_8_ = local_650._8_8_ & 0xffffffffffffff00;
  local_650._0_8_ = &PTR__lazy_ostream_013ae088;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_3a8,"main");
  local_5a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_5a0.m_message.px = (element_type *)0x0;
  local_5a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5a8 = "";
  local_2e8._8_8_ = &local_5b8;
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae148;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_5c0 = &local_5e0;
  local_5e0 = "main";
  local_5d0 = (element_type *)((ulong)local_5d0 & 0xffffffffffffff00);
  local_5d8 = (pointer)&PTR__lazy_ostream_013ae998;
  sStack_5c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_5b8 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_5a0,(lazy_ostream *)local_650,1,2,REQUIRE,0xe5ef7f,(size_t)&local_5b0,0x297,
             (lazy_ostream *)local_2f8,"\"main\"",(assertion_result *)&local_5d8);
  boost::detail::shared_count::~shared_count(&local_5a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  local_660 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_658 = "";
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x299;
  file_01.m_begin = (iterator)&local_660;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_670,
             msg_01);
  _cVar8 = 0x27c9c7;
  bVar2 = ArgsManager::ParseParameters(&test_args.super_ArgsManager,2,argv_testnet,&error);
  local_5d8 = (pointer)CONCAT71(local_5d8._1_7_,bVar2);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_650._0_8_ = "test_args.ParseParameters(2, argv_testnet, error)";
  local_650._8_8_ = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_678 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_2e8._8_8_ = (lazy_ostream *)local_650;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,0,WARN,_cVar8,
             (size_t)&local_680,0x299);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_688 = "";
  local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x29a;
  file_02.m_begin = (iterator)&local_690;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_6a0,
             msg_02);
  local_650._8_8_ = local_650._8_8_ & 0xffffffffffffff00;
  local_650._0_8_ = &PTR__lazy_ostream_013ae088;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_3a8,"test");
  local_5a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_5a0.m_message.px = (element_type *)0x0;
  local_5a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5a8 = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae148;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8._8_8_ = &local_5b8;
  local_5e0 = "test";
  local_5d0 = (element_type *)((ulong)local_5d0 & 0xffffffffffffff00);
  local_5d8 = (pointer)&PTR__lazy_ostream_013ae998;
  sStack_5c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5c0 = &local_5e0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_5b8 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_5a0,(lazy_ostream *)local_650,1,2,REQUIRE,0xe5ef7f,(size_t)&local_5b0,0x29a,
             (lazy_ostream *)local_2f8,"\"test\"",(assertion_result *)&local_5d8);
  boost::detail::shared_count::~shared_count(&local_5a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  local_6b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x29c;
  file_03.m_begin = (iterator)&local_6b0;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_6c0,
             msg_03);
  _cVar8 = 0x27cc76;
  bVar2 = ArgsManager::ParseParameters(&test_args.super_ArgsManager,0,argv_testnet4,&error);
  local_5d8 = (pointer)CONCAT71(local_5d8._1_7_,bVar2);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_650._0_8_ = "test_args.ParseParameters(0, argv_testnet4, error)";
  local_650._8_8_ = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_6c8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_2e8._8_8_ = (lazy_ostream *)local_650;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,0,WARN,_cVar8,
             (size_t)&local_6d0,0x29c);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_6e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_6d8 = "";
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x29d;
  file_04.m_begin = (iterator)&local_6e0;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_6f0,
             msg_04);
  local_650._8_8_ = local_650._8_8_ & 0xffffffffffffff00;
  local_650._0_8_ = &PTR__lazy_ostream_013ae088;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_3a8,"main");
  local_5a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_5a0.m_message.px = (element_type *)0x0;
  local_5a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5a8 = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae148;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8._8_8_ = &local_5b8;
  local_5e0 = "main";
  local_5d0 = (element_type *)((ulong)local_5d0 & 0xffffffffffffff00);
  local_5d8 = (pointer)&PTR__lazy_ostream_013ae998;
  sStack_5c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5c0 = &local_5e0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_5b8 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_5a0,(lazy_ostream *)local_650,1,2,REQUIRE,0xe5ef7f,(size_t)&local_5b0,0x29d,
             (lazy_ostream *)local_2f8,"\"main\"",(assertion_result *)&local_5d8);
  boost::detail::shared_count::~shared_count(&local_5a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_6f8 = "";
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x29f;
  file_05.m_begin = (iterator)&local_700;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_710,
             msg_05);
  _cVar8 = 0x27cf1a;
  bVar2 = ArgsManager::ParseParameters(&test_args.super_ArgsManager,2,argv_testnet4,&error);
  local_5d8 = (pointer)CONCAT71(local_5d8._1_7_,bVar2);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_650._0_8_ = "test_args.ParseParameters(2, argv_testnet4, error)";
  local_650._8_8_ = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_720 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_718 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_2e8._8_8_ = (lazy_ostream *)local_650;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,0,WARN,_cVar8,
             (size_t)&local_720,0x29f);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_730 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_728 = "";
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x2a0;
  file_06.m_begin = (iterator)&local_730;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_740,
             msg_06);
  local_650._8_8_ = local_650._8_8_ & 0xffffffffffffff00;
  local_650._0_8_ = &PTR__lazy_ostream_013ae088;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_3a8,"testnet4");
  local_5a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_5a0.m_message.px = (element_type *)0x0;
  local_5a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5a8 = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae148;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8._8_8_ = &local_5b8;
  local_5e0 = "testnet4";
  local_5d0 = (element_type *)((ulong)local_5d0 & 0xffffffffffffff00);
  local_5d8 = (pointer)&PTR__lazy_ostream_013ae858;
  sStack_5c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5c0 = &local_5e0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_5b8 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_5a0,(lazy_ostream *)local_650,1,2,REQUIRE,0xe5ef7f,(size_t)&local_5b0,0x2a0,
             (lazy_ostream *)local_2f8,"\"testnet4\"",(assertion_result *)&local_5d8);
  boost::detail::shared_count::~shared_count(&local_5a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  local_750 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_748 = "";
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x2a2;
  file_07.m_begin = (iterator)&local_750;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_760,
             msg_07);
  _cVar8 = 0x27d1c1;
  bVar2 = ArgsManager::ParseParameters(&test_args.super_ArgsManager,2,argv_regtest,&error);
  local_5d8 = (pointer)CONCAT71(local_5d8._1_7_,bVar2);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_650._0_8_ = "test_args.ParseParameters(2, argv_regtest, error)";
  local_650._8_8_ = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_770 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_768 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_2e8._8_8_ = (lazy_ostream *)local_650;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,0,WARN,_cVar8,
             (size_t)&local_770,0x2a2);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x2a3;
  file_08.m_begin = (iterator)&local_780;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_790,
             msg_08);
  local_650._8_8_ = local_650._8_8_ & 0xffffffffffffff00;
  local_650._0_8_ = &PTR__lazy_ostream_013ae088;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_3a8,"regtest");
  local_5a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_5a0.m_message.px = (element_type *)0x0;
  local_5a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5a8 = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae148;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8._8_8_ = &local_5b8;
  local_5e0 = "regtest";
  local_5d0 = (element_type *)((ulong)local_5d0 & 0xffffffffffffff00);
  local_5d8 = (pointer)&PTR__lazy_ostream_013ae918;
  sStack_5c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5c0 = &local_5e0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_5b8 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_5a0,(lazy_ostream *)local_650,1,2,REQUIRE,0xe5ef7f,(size_t)&local_5b0,0x2a3,
             (lazy_ostream *)local_2f8,"\"regtest\"",(assertion_result *)&local_5d8);
  boost::detail::shared_count::~shared_count(&local_5a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  local_7a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_798 = "";
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x2a5;
  file_09.m_begin = (iterator)&local_7a0;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_7b0,
             msg_09);
  _cVar8 = 0x27d468;
  bVar2 = ArgsManager::ParseParameters(&test_args.super_ArgsManager,3,argv_test_no_reg,&error);
  local_5d8 = (pointer)CONCAT71(local_5d8._1_7_,bVar2);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_650._0_8_ = "test_args.ParseParameters(3, argv_test_no_reg, error)";
  local_650._8_8_ = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_7c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_7b8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_2e8._8_8_ = (lazy_ostream *)local_650;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,0,WARN,_cVar8,
             (size_t)&local_7c0,0x2a5);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_7d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_7c8 = "";
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x2a6;
  file_10.m_begin = (iterator)&local_7d0;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_7e0,
             msg_10);
  local_650._8_8_ = local_650._8_8_ & 0xffffffffffffff00;
  local_650._0_8_ = &PTR__lazy_ostream_013ae088;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_3a8,"test");
  local_5a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_5a0.m_message.px = (element_type *)0x0;
  local_5a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5a8 = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae148;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8._8_8_ = &local_5b8;
  local_5e0 = "test";
  local_5d0 = (element_type *)((ulong)local_5d0 & 0xffffffffffffff00);
  local_5d8 = (pointer)&PTR__lazy_ostream_013ae998;
  sStack_5c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5c0 = &local_5e0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_5b8 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_5a0,(lazy_ostream *)local_650,1,2,REQUIRE,0xe5ef7f,(size_t)&local_5b0,0x2a6,
             (lazy_ostream *)local_2f8,"\"test\"",(assertion_result *)&local_5d8);
  boost::detail::shared_count::~shared_count(&local_5a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  local_7f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_7e8 = "";
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x2a8;
  file_11.m_begin = (iterator)&local_7f0;
  msg_11.m_end = pvVar6;
  msg_11.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_800,
             msg_11);
  _cVar8 = 0x27d713;
  bVar2 = ArgsManager::ParseParameters(&test_args.super_ArgsManager,3,argv_both,&error);
  local_5d8 = (pointer)CONCAT71(local_5d8._1_7_,bVar2);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_650._0_8_ = "test_args.ParseParameters(3, argv_both, error)";
  local_650._8_8_ = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_810 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_808 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_2e8._8_8_ = (lazy_ostream *)local_650;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,0,WARN,_cVar8,
             (size_t)&local_810,0x2a8);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_820 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_818 = "";
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x2a9;
  file_12.m_begin = (iterator)&local_820;
  msg_12.m_end = pvVar6;
  msg_12.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_830,
             msg_12);
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3c8,&test_args.super_ArgsManager);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  local_840 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_838 = "";
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar8 = 0x27d852;
  file_13.m_end = (iterator)0x2a9;
  file_13.m_begin = (iterator)&local_840;
  msg_13.m_end = pvVar6;
  msg_13.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_850,
             msg_13);
  local_5d8 = (pointer)((ulong)local_5d8 & 0xffffffffffffff00);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae9d8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8._8_8_ = "exception std::runtime_error expected but not raised";
  local_860 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_858 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,1,WARN,_cVar8,
             (size_t)&local_860,0x2a9);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_8a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_898 = "";
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x2ab;
  file_14.m_begin = (iterator)&local_8a0;
  msg_14.m_end = pvVar6;
  msg_14.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_8b0,
             msg_14);
  _cVar8 = 0x27d938;
  bVar2 = ArgsManager::ParseParameters(&test_args.super_ArgsManager,0,argv_testnet,&error);
  local_5d8 = (pointer)CONCAT71(local_5d8._1_7_,bVar2);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_650._0_8_ = "test_args.ParseParameters(0, argv_testnet, error)";
  local_650._8_8_ = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_8c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_8b8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_2e8._8_8_ = (lazy_ostream *)local_650;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,0,WARN,_cVar8,
             (size_t)&local_8c0,0x2ab);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3e8,"testnet=1\nregtest=0\n[test]\nregtest=1","");
  TestArgsManager::ReadConfigString(&test_args,in_stack_fffffffffffff2c8);
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0],local_3d8[0] + 1);
  }
  local_8d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_8c8 = "";
  local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x2ad;
  file_15.m_begin = (iterator)&local_8d0;
  msg_15.m_end = pvVar6;
  msg_15.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_8e0,
             msg_15);
  local_650._8_8_ = local_650._8_8_ & 0xffffffffffffff00;
  local_650._0_8_ = &PTR__lazy_ostream_013ae088;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_3a8,"test");
  local_5a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_5a0.m_message.px = (element_type *)0x0;
  local_5a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5a8 = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae148;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8._8_8_ = &local_5b8;
  local_5e0 = "test";
  local_5d0 = (element_type *)((ulong)local_5d0 & 0xffffffffffffff00);
  local_5d8 = (pointer)&PTR__lazy_ostream_013ae998;
  sStack_5c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5c0 = &local_5e0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_5b8 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_5a0,(lazy_ostream *)local_650,1,2,REQUIRE,0xe5ef7f,(size_t)&local_5b0,0x2ad,
             (lazy_ostream *)local_2f8,"\"test\"",(assertion_result *)&local_5d8);
  boost::detail::shared_count::~shared_count(&local_5a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  local_8f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_8e8 = "";
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x2af;
  file_16.m_begin = (iterator)&local_8f0;
  msg_16.m_end = pvVar6;
  msg_16.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_900,
             msg_16);
  _cVar8 = 0x27dc4a;
  bVar2 = ArgsManager::ParseParameters(&test_args.super_ArgsManager,2,argv_testnet,&error);
  local_5d8 = (pointer)CONCAT71(local_5d8._1_7_,bVar2);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_650._0_8_ = "test_args.ParseParameters(2, argv_testnet, error)";
  local_650._8_8_ = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_910 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_908 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_2e8._8_8_ = (lazy_ostream *)local_650;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,0,WARN,_cVar8,
             (size_t)&local_910,0x2af);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_408[0] = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_408,"testnet=1\nregtest=0\n[test]\nregtest=1","");
  TestArgsManager::ReadConfigString(&test_args,in_stack_fffffffffffff2c8);
  if (local_408[0] != local_3f8) {
    operator_delete(local_408[0],local_3f8[0] + 1);
  }
  local_920 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_918 = "";
  local_930 = &boost::unit_test::basic_cstring<char_const>::null;
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x2b1;
  file_17.m_begin = (iterator)&local_920;
  msg_17.m_end = pvVar6;
  msg_17.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_930,
             msg_17);
  local_650._8_8_ = local_650._8_8_ & 0xffffffffffffff00;
  local_650._0_8_ = &PTR__lazy_ostream_013ae088;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_3a8,"test");
  local_5a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_5a0.m_message.px = (element_type *)0x0;
  local_5a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5a8 = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae148;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8._8_8_ = &local_5b8;
  local_5e0 = "test";
  local_5d0 = (element_type *)((ulong)local_5d0 & 0xffffffffffffff00);
  local_5d8 = (pointer)&PTR__lazy_ostream_013ae998;
  sStack_5c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5c0 = &local_5e0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_5b8 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_5a0,(lazy_ostream *)local_650,1,2,REQUIRE,0xe5ef7f,(size_t)&local_5b0,0x2b1,
             (lazy_ostream *)local_2f8,"\"test\"",(assertion_result *)&local_5d8);
  boost::detail::shared_count::~shared_count(&local_5a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  local_940 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_938 = "";
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  local_948 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x2b3;
  file_18.m_begin = (iterator)&local_940;
  msg_18.m_end = pvVar6;
  msg_18.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_950,
             msg_18);
  _cVar8 = 0x27df5c;
  bVar2 = ArgsManager::ParseParameters(&test_args.super_ArgsManager,2,argv_regtest,&error);
  local_5d8 = (pointer)CONCAT71(local_5d8._1_7_,bVar2);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_650._0_8_ = "test_args.ParseParameters(2, argv_regtest, error)";
  local_650._8_8_ = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_960 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_958 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_2e8._8_8_ = (lazy_ostream *)local_650;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,0,WARN,_cVar8,
             (size_t)&local_960,0x2b3);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_428[0] = local_418;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_428,"testnet=1\nregtest=0\n[test]\nregtest=1","");
  TestArgsManager::ReadConfigString(&test_args,in_stack_fffffffffffff2c8);
  if (local_428[0] != local_418) {
    operator_delete(local_428[0],local_418[0] + 1);
  }
  local_970 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_968 = "";
  local_980 = &boost::unit_test::basic_cstring<char_const>::null;
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x2b5;
  file_19.m_begin = (iterator)&local_970;
  msg_19.m_end = pvVar6;
  msg_19.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_980,
             msg_19);
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_448,&test_args.super_ArgsManager);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_990 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_988 = "";
  local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_998 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar8 = 0x27e103;
  file_20.m_end = (iterator)0x2b5;
  file_20.m_begin = (iterator)&local_990;
  msg_20.m_end = pvVar6;
  msg_20.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_9a0,
             msg_20);
  local_5d8 = (pointer)((ulong)local_5d8 & 0xffffffffffffff00);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae9d8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8._8_8_ = "exception std::runtime_error expected but not raised";
  local_9b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_9a8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,1,WARN,_cVar8,
             (size_t)&local_9b0,0x2b5);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_9f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_9e8 = "";
  local_a00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x2b7;
  file_21.m_begin = (iterator)&local_9f0;
  msg_21.m_end = pvVar6;
  msg_21.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_a00,
             msg_21);
  _cVar8 = 0x27e1ec;
  bVar2 = ArgsManager::ParseParameters(&test_args.super_ArgsManager,3,argv_test_no_reg,&error);
  local_5d8 = (pointer)CONCAT71(local_5d8._1_7_,bVar2);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_650._0_8_ = "test_args.ParseParameters(3, argv_test_no_reg, error)";
  local_650._8_8_ = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_a10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_a08 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_2e8._8_8_ = (lazy_ostream *)local_650;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,0,WARN,_cVar8,
             (size_t)&local_a10,0x2b7);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_468[0] = local_458;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_468,"testnet=1\nregtest=0\n[test]\nregtest=1","");
  TestArgsManager::ReadConfigString(&test_args,in_stack_fffffffffffff2c8);
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  local_a20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_a18 = "";
  local_a30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a28 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x2b9;
  file_22.m_begin = (iterator)&local_a20;
  msg_22.m_end = pvVar6;
  msg_22.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_a30,
             msg_22);
  local_650._8_8_ = local_650._8_8_ & 0xffffffffffffff00;
  local_650._0_8_ = &PTR__lazy_ostream_013ae088;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_3a8,"test");
  local_5a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_5a0.m_message.px = (element_type *)0x0;
  local_5a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5a8 = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae148;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8._8_8_ = &local_5b8;
  local_5e0 = "test";
  local_5d0 = (element_type *)((ulong)local_5d0 & 0xffffffffffffff00);
  local_5d8 = (pointer)&PTR__lazy_ostream_013ae998;
  sStack_5c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5c0 = &local_5e0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_5b8 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_5a0,(lazy_ostream *)local_650,1,2,REQUIRE,0xe5ef7f,(size_t)&local_5b0,0x2b9,
             (lazy_ostream *)local_2f8,"\"test\"",(assertion_result *)&local_5d8);
  boost::detail::shared_count::~shared_count(&local_5a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  local_a40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_a38 = "";
  local_a50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x2bb;
  file_23.m_begin = (iterator)&local_a40;
  msg_23.m_end = pvVar6;
  msg_23.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_a50,
             msg_23);
  _cVar8 = 0x27e4fe;
  bVar2 = ArgsManager::ParseParameters(&test_args.super_ArgsManager,3,argv_both,&error);
  local_5d8 = (pointer)CONCAT71(local_5d8._1_7_,bVar2);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_650._0_8_ = "test_args.ParseParameters(3, argv_both, error)";
  local_650._8_8_ = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_a60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_a58 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_2e8._8_8_ = (lazy_ostream *)local_650;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,0,WARN,_cVar8,
             (size_t)&local_a60,699);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_488[0] = local_478;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_488,"testnet=1\nregtest=0\n[test]\nregtest=1","");
  TestArgsManager::ReadConfigString(&test_args,in_stack_fffffffffffff2c8);
  if (local_488[0] != local_478) {
    operator_delete(local_488[0],local_478[0] + 1);
  }
  local_a70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_a68 = "";
  local_a80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x2bd;
  file_24.m_begin = (iterator)&local_a70;
  msg_24.m_end = pvVar6;
  msg_24.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_a80,
             msg_24);
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_4a8,&test_args.super_ArgsManager);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  local_a90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_a88 = "";
  local_aa0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a98 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar8 = 0x27e6a4;
  file_25.m_end = (iterator)0x2bd;
  file_25.m_begin = (iterator)&local_a90;
  msg_25.m_end = pvVar6;
  msg_25.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_aa0,
             msg_25);
  local_5d8 = (pointer)((ulong)local_5d8 & 0xffffffffffffff00);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae9d8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8._8_8_ = "exception std::runtime_error expected but not raised";
  local_ab0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_aa8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,1,WARN,_cVar8,
             (size_t)&local_ab0,0x2bd);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_2f8._0_8_ = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"test","");
  ArgsManager::SelectConfigNetwork(&test_args.super_ArgsManager,(string *)local_2f8);
  if ((undefined1 *)local_2f8._0_8_ != local_2e8) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2e8._0_8_ + 1));
  }
  local_af0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_ae8 = "";
  local_b00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x2c3;
  file_26.m_begin = (iterator)&local_af0;
  msg_26.m_end = pvVar6;
  msg_26.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_b00,
             msg_26);
  _cVar8 = 0x27e7e7;
  bVar2 = ArgsManager::ParseParameters(&test_args.super_ArgsManager,0,argv_testnet,&error);
  local_5d8 = (pointer)CONCAT71(local_5d8._1_7_,bVar2);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_650._0_8_ = "test_args.ParseParameters(0, argv_testnet, error)";
  local_650._8_8_ = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_b10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_b08 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_2e8._8_8_ = (lazy_ostream *)local_650;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,0,WARN,_cVar8,
             (size_t)&local_b10,0x2c3);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_4c8[0] = local_4b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c8,"testnet=1\nregtest=0\n[test]\nregtest=1","");
  TestArgsManager::ReadConfigString(&test_args,in_stack_fffffffffffff2c8);
  if (local_4c8[0] != local_4b8) {
    operator_delete(local_4c8[0],local_4b8[0] + 1);
  }
  local_b20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_b18 = "";
  local_b30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b28 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x2c5;
  file_27.m_begin = (iterator)&local_b20;
  msg_27.m_end = pvVar6;
  msg_27.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_b30,
             msg_27);
  local_650._8_8_ = local_650._8_8_ & 0xffffffffffffff00;
  local_650._0_8_ = &PTR__lazy_ostream_013ae088;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_3a8,"test");
  local_5a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_5a0.m_message.px = (element_type *)0x0;
  local_5a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5a8 = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae148;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8._8_8_ = &local_5b8;
  local_5e0 = "test";
  local_5d0 = (element_type *)((ulong)local_5d0 & 0xffffffffffffff00);
  local_5d8 = (pointer)&PTR__lazy_ostream_013ae998;
  sStack_5c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5c0 = &local_5e0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_5b8 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_5a0,(lazy_ostream *)local_650,1,2,REQUIRE,0xe5ef7f,(size_t)&local_5b0,0x2c5,
             (lazy_ostream *)local_2f8,"\"test\"",(assertion_result *)&local_5d8);
  boost::detail::shared_count::~shared_count(&local_5a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  local_b40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_b38 = "";
  local_b50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b48 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x2c7;
  file_28.m_begin = (iterator)&local_b40;
  msg_28.m_end = pvVar6;
  msg_28.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_b50,
             msg_28);
  _cVar8 = 0x27eaf2;
  bVar2 = ArgsManager::ParseParameters(&test_args.super_ArgsManager,2,argv_testnet,&error);
  local_5d8 = (pointer)CONCAT71(local_5d8._1_7_,bVar2);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_650._0_8_ = "test_args.ParseParameters(2, argv_testnet, error)";
  local_650._8_8_ = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_b60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_b58 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_2e8._8_8_ = (lazy_ostream *)local_650;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,0,WARN,_cVar8,
             (size_t)&local_b60,0x2c7);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_4e8[0] = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4e8,"testnet=1\nregtest=0\n[test]\nregtest=1","");
  TestArgsManager::ReadConfigString(&test_args,in_stack_fffffffffffff2c8);
  if (local_4e8[0] != local_4d8) {
    operator_delete(local_4e8[0],local_4d8[0] + 1);
  }
  local_b70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_b68 = "";
  local_b80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x2c9;
  file_29.m_begin = (iterator)&local_b70;
  msg_29.m_end = pvVar6;
  msg_29.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_b80,
             msg_29);
  local_650._8_8_ = local_650._8_8_ & 0xffffffffffffff00;
  local_650._0_8_ = &PTR__lazy_ostream_013ae088;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_3a8,"test");
  local_5a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_5a0.m_message.px = (element_type *)0x0;
  local_5a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5a8 = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae148;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8._8_8_ = &local_5b8;
  local_5e0 = "test";
  local_5d0 = (element_type *)((ulong)local_5d0 & 0xffffffffffffff00);
  local_5d8 = (pointer)&PTR__lazy_ostream_013ae998;
  sStack_5c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5c0 = &local_5e0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_5b8 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_5a0,(lazy_ostream *)local_650,1,2,REQUIRE,0xe5ef7f,(size_t)&local_5b0,0x2c9,
             (lazy_ostream *)local_2f8,"\"test\"",(assertion_result *)&local_5d8);
  boost::detail::shared_count::~shared_count(&local_5a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  local_b90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_b88 = "";
  local_ba0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x2cb;
  file_30.m_begin = (iterator)&local_b90;
  msg_30.m_end = pvVar6;
  msg_30.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_ba0,
             msg_30);
  _cVar8 = 0x27edfd;
  bVar2 = ArgsManager::ParseParameters(&test_args.super_ArgsManager,2,argv_regtest,&error);
  local_5d8 = (pointer)CONCAT71(local_5d8._1_7_,bVar2);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_650._0_8_ = "test_args.ParseParameters(2, argv_regtest, error)";
  local_650._8_8_ = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_bb0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_ba8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_2e8._8_8_ = (lazy_ostream *)local_650;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,0,WARN,_cVar8,
             (size_t)&local_bb0,0x2cb);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_508[0] = local_4f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_508,"testnet=1\nregtest=0\n[test]\nregtest=1","");
  TestArgsManager::ReadConfigString(&test_args,in_stack_fffffffffffff2c8);
  if (local_508[0] != local_4f8) {
    operator_delete(local_508[0],local_4f8[0] + 1);
  }
  local_bc0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_bb8 = "";
  local_bd0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bc8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x2cd;
  file_31.m_begin = (iterator)&local_bc0;
  msg_31.m_end = pvVar6;
  msg_31.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_bd0,
             msg_31);
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_528,&test_args.super_ArgsManager);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  local_be0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_bd8 = "";
  local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_be8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar8 = 0x27efa4;
  file_32.m_end = (iterator)0x2cd;
  file_32.m_begin = (iterator)&local_be0;
  msg_32.m_end = pvVar6;
  msg_32.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_bf0,
             msg_32);
  local_5d8 = (pointer)((ulong)local_5d8 & 0xffffffffffffff00);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae9d8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8._8_8_ = "exception std::runtime_error expected but not raised";
  local_c00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_bf8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,1,WARN,_cVar8,
             (size_t)&local_c00,0x2cd);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_c40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_c38 = "";
  local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c48 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x2cf;
  file_33.m_begin = (iterator)&local_c40;
  msg_33.m_end = pvVar6;
  msg_33.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_c50,
             msg_33);
  _cVar8 = 0x27f08d;
  bVar2 = ArgsManager::ParseParameters(&test_args.super_ArgsManager,2,argv_test_no_reg,&error);
  local_5d8 = (pointer)CONCAT71(local_5d8._1_7_,bVar2);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_650._0_8_ = "test_args.ParseParameters(2, argv_test_no_reg, error)";
  local_650._8_8_ = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_c60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_c58 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_2e8._8_8_ = (lazy_ostream *)local_650;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,0,WARN,_cVar8,
             (size_t)&local_c60,0x2cf);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_548[0] = local_538;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_548,"testnet=1\nregtest=0\n[test]\nregtest=1","");
  TestArgsManager::ReadConfigString(&test_args,in_stack_fffffffffffff2c8);
  if (local_548[0] != local_538) {
    operator_delete(local_548[0],local_538[0] + 1);
  }
  local_c70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_c68 = "";
  local_c80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x2d1;
  file_34.m_begin = (iterator)&local_c70;
  msg_34.m_end = pvVar6;
  msg_34.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_c80,
             msg_34);
  local_650._8_8_ = local_650._8_8_ & 0xffffffffffffff00;
  local_650._0_8_ = &PTR__lazy_ostream_013ae088;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = "";
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_3a8,&test_args.super_ArgsManager);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_3a8,"test");
  local_5a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  local_5a0.m_message.px = (element_type *)0x0;
  local_5a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_5a8 = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae148;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8._8_8_ = &local_5b8;
  local_5e0 = "test";
  local_5d0 = (element_type *)((ulong)local_5d0 & 0xffffffffffffff00);
  local_5d8 = (pointer)&PTR__lazy_ostream_013ae998;
  sStack_5c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5c0 = &local_5e0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_5b8 = &local_3a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_5a0,(lazy_ostream *)local_650,1,2,REQUIRE,0xe5ef7f,(size_t)&local_5b0,0x2d1,
             (lazy_ostream *)local_2f8,"\"test\"",(assertion_result *)&local_5d8);
  boost::detail::shared_count::~shared_count(&local_5a0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  local_c90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_c88 = "";
  local_ca0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c98 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x2d3;
  file_35.m_begin = (iterator)&local_c90;
  msg_35.m_end = pvVar6;
  msg_35.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_ca0,
             msg_35);
  _cVar8 = 0x27f398;
  bVar2 = ArgsManager::ParseParameters(&test_args.super_ArgsManager,3,argv_both,&error);
  local_5d8 = (pointer)CONCAT71(local_5d8._1_7_,bVar2);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_650._0_8_ = "test_args.ParseParameters(3, argv_both, error)";
  local_650._8_8_ = "";
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_cb0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_ca8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_2e8._8_8_ = (lazy_ostream *)local_650;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,0,WARN,_cVar8,
             (size_t)&local_cb0,0x2d3);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  local_568[0] = local_558;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_568,"testnet=1\nregtest=0\n[test]\nregtest=1","");
  TestArgsManager::ReadConfigString(&test_args,in_stack_fffffffffffff2c8);
  if (local_568[0] != local_558) {
    operator_delete(local_568[0],local_558[0] + 1);
  }
  local_cc0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_cb8 = "";
  local_cd0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cc8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x2d5;
  file_36.m_begin = (iterator)&local_cc0;
  msg_36.m_end = pvVar6;
  msg_36.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_cd0,
             msg_36);
  ArgsManager::GetChainTypeString_abi_cxx11_(&local_588,&test_args.super_ArgsManager);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  local_ce0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_cd8 = "";
  local_cf0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ce8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar8 = 0x27f516;
  file_37.m_end = (iterator)0x2d5;
  file_37.m_begin = (iterator)&local_ce0;
  msg_37.m_end = pvVar6;
  msg_37.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_cf0,
             msg_37);
  local_5d8 = (pointer)((ulong)local_5d8 & 0xffffffffffffff00);
  local_5d0 = (element_type *)0x0;
  sStack_5c8.pi_ = (sp_counted_base *)0x0;
  local_2f8[8] = false;
  local_2f8._0_8_ = &PTR__lazy_ostream_013ae9d8;
  local_2e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e8._8_8_ = "exception std::runtime_error expected but not raised";
  local_d00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_cf8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_5d8,(lazy_ostream *)local_2f8,1,1,WARN,_cVar8,
             (size_t)&local_d00,0x2d5);
  boost::detail::shared_count::~shared_count(&sStack_5c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error._M_dataplus._M_p != &error.field_2) {
    operator_delete(error._M_dataplus._M_p,
                    CONCAT71(error.field_2._M_allocated_capacity._1_7_,error.field_2._M_local_buf[0]
                            ) + 1);
  }
  ArgsManager::~ArgsManager(&test_args.super_ArgsManager);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_GetChainTypeString)
{
    TestArgsManager test_args;
    const auto testnet = std::make_pair("-testnet", ArgsManager::ALLOW_ANY);
    const auto testnet4 = std::make_pair("-testnet4", ArgsManager::ALLOW_ANY);
    const auto regtest = std::make_pair("-regtest", ArgsManager::ALLOW_ANY);
    test_args.SetupArgs({testnet, testnet4, regtest});

    const char* argv_testnet[] = {"cmd", "-testnet"};
    const char* argv_testnet4[] = {"cmd", "-testnet4"};
    const char* argv_regtest[] = {"cmd", "-regtest"};
    const char* argv_test_no_reg[] = {"cmd", "-testnet", "-noregtest"};
    const char* argv_both[] = {"cmd", "-testnet", "-regtest"};

    // equivalent to "-testnet"
    // regtest in testnet section is ignored
    const char* testnetconf = "testnet=1\nregtest=0\n[test]\nregtest=1";
    std::string error;

    BOOST_CHECK(test_args.ParseParameters(0, argv_testnet, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "main");

    BOOST_CHECK(test_args.ParseParameters(2, argv_testnet, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(0, argv_testnet4, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "main");

    BOOST_CHECK(test_args.ParseParameters(2, argv_testnet4, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "testnet4");

    BOOST_CHECK(test_args.ParseParameters(2, argv_regtest, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "regtest");

    BOOST_CHECK(test_args.ParseParameters(3, argv_test_no_reg, error));
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(3, argv_both, error));
    BOOST_CHECK_THROW(test_args.GetChainTypeString(), std::runtime_error);

    BOOST_CHECK(test_args.ParseParameters(0, argv_testnet, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(2, argv_testnet, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(2, argv_regtest, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_THROW(test_args.GetChainTypeString(), std::runtime_error);

    BOOST_CHECK(test_args.ParseParameters(3, argv_test_no_reg, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(3, argv_both, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_THROW(test_args.GetChainTypeString(), std::runtime_error);

    // check setting the network to test (and thus making
    // [test] regtest=1 potentially relevant) doesn't break things
    test_args.SelectConfigNetwork("test");

    BOOST_CHECK(test_args.ParseParameters(0, argv_testnet, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(2, argv_testnet, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(2, argv_regtest, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_THROW(test_args.GetChainTypeString(), std::runtime_error);

    BOOST_CHECK(test_args.ParseParameters(2, argv_test_no_reg, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_EQUAL(test_args.GetChainTypeString(), "test");

    BOOST_CHECK(test_args.ParseParameters(3, argv_both, error));
    test_args.ReadConfigString(testnetconf);
    BOOST_CHECK_THROW(test_args.GetChainTypeString(), std::runtime_error);
}